

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.cc
# Opt level: O3

void __thiscall vw::vw(vw *this,vw *param_1)

{
  _Rb_tree_header *p_Var1;
  vw_exception *this_00;
  stringstream __msg;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8;
  
  (this->parse_thread)._M_id._M_thread = 0;
  (this->data_filename)._M_dataplus._M_p = (pointer)&(this->data_filename).field_2;
  (this->data_filename)._M_string_length = 0;
  (this->data_filename).field_2._M_local_buf[0] = '\0';
  (this->id)._M_dataplus._M_p = (pointer)&(this->id).field_2;
  (this->id)._M_string_length = 0;
  (this->id).field_2._M_local_buf[0] = '\0';
  (this->model_file_ver).major = 0;
  (this->model_file_ver).minor = 0;
  (this->model_file_ver).rev = 0;
  this->vw_is_main = false;
  vw_ostream::vw_ostream(&this->trace_message);
  this->should_delete_options = false;
  (this->initial_regressors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->initial_regressors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->initial_regressors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->feature_mask)._M_dataplus._M_p = (pointer)&(this->feature_mask).field_2;
  (this->feature_mask)._M_string_length = 0;
  (this->feature_mask).field_2._M_local_buf[0] = '\0';
  (this->per_feature_regularizer_input)._M_dataplus._M_p =
       (pointer)&(this->per_feature_regularizer_input).field_2;
  (this->per_feature_regularizer_input)._M_string_length = 0;
  (this->per_feature_regularizer_input).field_2._M_local_buf[0] = '\0';
  (this->per_feature_regularizer_output)._M_dataplus._M_p =
       (pointer)&(this->per_feature_regularizer_output).field_2;
  (this->per_feature_regularizer_output)._M_string_length = 0;
  (this->per_feature_regularizer_output).field_2._M_local_buf[0] = '\0';
  (this->per_feature_regularizer_text)._M_dataplus._M_p =
       (pointer)&(this->per_feature_regularizer_text).field_2;
  (this->per_feature_regularizer_text)._M_string_length = 0;
  (this->per_feature_regularizer_text).field_2._M_local_buf[0] = '\0';
  (this->limit_strings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->limit_strings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->limit_strings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->triples).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->triples).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pairs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pairs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->interactions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pairs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->interactions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->interactions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->triples).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->skip_strings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->skip_strings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ngram_strings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->skip_strings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ngram_strings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ngram_strings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  memset(&this->dictionary_path,0,0x1830);
  (this->text_regressor_name)._M_dataplus._M_p = (pointer)&(this->text_regressor_name).field_2;
  (this->text_regressor_name)._M_string_length = 0;
  (this->text_regressor_name).field_2._M_local_buf[0] = '\0';
  (this->inv_hash_regressor_name)._M_dataplus._M_p =
       (pointer)&(this->inv_hash_regressor_name).field_2;
  (this->inv_hash_regressor_name)._M_string_length = 0;
  (this->inv_hash_regressor_name).field_2._M_local_buf[0] = '\0';
  (this->reduction_stack).c.
  super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->reduction_stack).c.
  super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->reduction_stack).c.
  super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->reduction_stack).c.
  super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->reduction_stack).c.
  super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->reduction_stack).c.
  super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->reduction_stack).c.
  super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->reduction_stack).c.
  super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->reduction_stack).c.
  super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->reduction_stack).c.
  super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
  ::_M_initialize_map((_Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
                       *)&this->reduction_stack,0);
  (this->final_regressor_name)._M_dataplus._M_p = (pointer)&(this->final_regressor_name).field_2;
  (this->final_regressor_name)._M_string_length = 0;
  (this->final_regressor_name).field_2._M_local_buf[0] = '\0';
  (this->weights).dense_weights._begin = (weight *)0x0;
  (this->weights).dense_weights._weight_mask = 0;
  *(undefined8 *)((long)&(this->weights).dense_weights._weight_mask + 5) = 0;
  sparse_parameters::sparse_parameters(&(this->weights).sparse_weights);
  p_Var1 = &(this->name_index_map)._M_t._M_impl.super__Rb_tree_header;
  (this->name_index_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->name_index_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->name_index_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->name_index_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->name_index_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (&local_1a8,"Copy constructor not supported",0x1e);
  this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/global_data.cc"
             ,0x109,&local_1d8);
  __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

vw::vw(const vw&) { THROW("Copy constructor not supported"); }